

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

QVariant * __thiscall QWizard::field(QVariant *__return_storage_ptr__,QWizard *this,QString *name)

{
  int iVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  int local_40 [6];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40[0] = -1;
  iVar1 = QMap<QString,_int>::value
                    ((QMap<QString,_int> *)
                     (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x300),name,local_40
                    );
  if (iVar1 == -1) {
    local_40[0] = 2;
    local_40[5] = 0;
    local_40[1] = 0;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40[4] = 0;
    local_28 = "default";
    uVar2 = QString::utf16();
    QMessageLogger::warning((char *)local_40,"QWizard::field: No such field \'%ls\'",uVar2);
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QObject::property((char *)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QWizard::field(const QString &name) const
{
    Q_D(const QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::field: No such field '%ls'", qUtf16Printable(name));
        return QVariant();
    }

    const QWizardField &field = d->fields.at(index);
    return field.object->property(field.property);
}